

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O1

void __thiscall
duckdb::AttachedDatabase::Initialize
          (AttachedDatabase *this,optional_ptr<duckdb::ClientContext,_true> context,
          StorageOptions options)

{
  AttachedDatabaseType AVar1;
  pointer pCVar2;
  pointer this_00;
  
  AVar1 = this->type;
  pCVar2 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator->
                     (&this->catalog);
  (*pCVar2->_vptr_Catalog[4])(pCVar2,context.ptr,(ulong)(AVar1 == SYSTEM_DATABASE));
  if ((this->storage).
      super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
      .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl != (StorageManager *)0x0)
  {
    this_00 = unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>,_true>
              ::operator->(&this->storage);
    StorageManager::Initialize(this_00,options);
    return;
  }
  return;
}

Assistant:

void AttachedDatabase::Initialize(optional_ptr<ClientContext> context, StorageOptions options) {
	if (IsSystem()) {
		catalog->Initialize(context, true);
	} else {
		catalog->Initialize(context, false);
	}
	if (storage) {
		storage->Initialize(options);
	}
}